

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall lest::transformed_abi_cxx11_(string *__return_storage_ptr__,lest *this,char chr)

{
  long lVar1;
  long lVar2;
  byte c;
  anon_class_1_0_00000001 to_hex_string;
  allocator<char> local_9;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    c = (byte)this;
    if (lVar2 == 0x50) {
      if (c < 0x20) {
        transformed[abi:cxx11](char)::{lambda(char)#2}::operator()[abi_cxx11_
                  (__return_storage_ptr__,&to_hex_string,c);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
      return __return_storage_ptr__;
    }
    lVar1 = lVar2 + 0x10;
  } while ((&DAT_00181230)[lVar2] != c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             *(char **)((long)&PTR_anon_var_dwarf_250b3_00181238 + lVar2),&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( auto tr : table )
    {
        if ( chr == tr.chr )
            return tr.str;
    }

    // The cast below helps suppress warnings ("-Wtype-limits" on GCC) on architectures where `char` is unsigned.
    auto unprintable = [](char c){ return 0 <= static_cast<signed char>(c) && c < ' '; };

    auto to_hex_string = [](char c)
    {
        std::ostringstream os;
        os << "\\x" << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>( static_cast<unsigned char>(c) );
        return os.str();
    };

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}